

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlAttachObjectToDictionaryObject
                    (JlDataObject *DictionaryObject,char *KeyName,JlDataObject *NewObject)

{
  JlDataObject *pJVar1;
  JlDictionaryItem *Memory;
  JlDictionaryItem *dictionaryItem;
  JL_STATUS jlStatus;
  JlDataObject *NewObject_local;
  char *KeyName_local;
  JlDataObject *DictionaryObject_local;
  
  if ((((DictionaryObject == (JlDataObject *)0x0) || (KeyName == (char *)0x0)) || (*KeyName == '\0')
      ) || (NewObject == (JlDataObject *)0x0)) {
    dictionaryItem._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else if (DictionaryObject->Type == JL_DATA_TYPE_DICTIONARY) {
    pJVar1 = FindDictionaryItem(&(DictionaryObject->field_2).Dictionary,KeyName);
    if (pJVar1 == (JlDataObject *)0x0) {
      Memory = (JlDictionaryItem *)WjTestLib_Calloc(0x20,1);
      if (Memory == (JlDictionaryItem *)0x0) {
        dictionaryItem._4_4_ = JL_STATUS_OUT_OF_MEMORY;
      }
      else {
        Memory->Next = (JlDictionaryItem *)0x0;
        Memory->Object = NewObject;
        Memory->ParentDictionary = (JlDictionary *)&DictionaryObject->field_2;
        pJVar1 = (JlDataObject *)JlStrDup(KeyName);
        Memory->KeyName = (char *)pJVar1;
        if ((JlDataObject *)Memory->KeyName == (JlDataObject *)0x0) {
          dictionaryItem._4_4_ = JL_STATUS_OUT_OF_MEMORY;
          WjTestLib_Free(Memory);
        }
        else {
          if ((DictionaryObject->field_2).List.ListHead == (JlListItem *)0x0) {
            (DictionaryObject->field_2).Dictionary.DictionaryHead = Memory;
          }
          else {
            ((DictionaryObject->field_2).List.ListHead)->Next = (JlListItem *)Memory;
          }
          (DictionaryObject->field_2).List.ListHead = (JlListItem *)Memory;
          dictionaryItem._4_4_ = JL_STATUS_SUCCESS;
        }
      }
    }
    else {
      dictionaryItem._4_4_ = JL_STATUS_DICTIONARY_ITEM_REPEATED;
    }
  }
  else {
    dictionaryItem._4_4_ = JL_STATUS_WRONG_TYPE;
  }
  return dictionaryItem._4_4_;
}

Assistant:

JL_STATUS
    JlAttachObjectToDictionaryObject
    (
        JlDataObject*   DictionaryObject,
        char const*     KeyName,
        JlDataObject*   NewObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  0 != KeyName[0]
        &&  NULL != NewObject )
    {
        if( JL_DATA_TYPE_DICTIONARY == DictionaryObject->Type )
        {
            // Check key does not already exist
            if( NULL == FindDictionaryItem( &DictionaryObject->Dictionary, KeyName ) )
            {
                // Create dictionary item container for object
                JlDictionaryItem* dictionaryItem = JlNew( JlDictionaryItem );
                if( NULL != dictionaryItem )
                {
                    dictionaryItem->Next = NULL;
                    dictionaryItem->Object = NewObject;
                    dictionaryItem->ParentDictionary = &DictionaryObject->Dictionary;
                    dictionaryItem->KeyName = JlStrDup( KeyName );
                    if( NULL != dictionaryItem->KeyName )
                    {
                        JlLinkedListAddToEnd( DictionaryObject->Dictionary.DictionaryHead, DictionaryObject->Dictionary.DictionaryTail, dictionaryItem );
                        jlStatus = JL_STATUS_SUCCESS;
                    }
                    else
                    {
                        jlStatus = JL_STATUS_OUT_OF_MEMORY;
                        JlFree( dictionaryItem );
                        dictionaryItem = NULL;
                    }
                }
                else
                {
                    jlStatus = JL_STATUS_OUT_OF_MEMORY;
                }
            }
            else
            {
                jlStatus = JL_STATUS_DICTIONARY_ITEM_REPEATED;
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}